

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMakeCurrentPerfTests.cpp
# Opt level: O0

void __thiscall deqp::egl::MakeCurrentPerfCase::createPixmap(MakeCurrentPerfCase *this)

{
  NativeDisplayFactory *factory;
  CommandLine *cmdLine;
  NativePixmapFactory *pNVar1;
  NativeDisplay *pNVar2;
  value_type local_38;
  EGLSurface surface;
  NativePixmap *pixmap;
  NativePixmapFactory *pixmapFactory;
  EGLint height;
  EGLint width;
  Library *egl;
  MakeCurrentPerfCase *this_local;
  
  egl = (Library *)this;
  _height = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  pixmapFactory._4_4_ = 0x100;
  pixmapFactory._0_4_ = 0x100;
  factory = EglTestContext::getNativeDisplayFactory((this->super_TestCase).m_eglTestCtx);
  cmdLine = tcu::TestContext::getCommandLine
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  pNVar1 = eglu::selectNativePixmapFactory(factory,cmdLine);
  surface = (EGLSurface)0x0;
  local_38 = (value_type)0x0;
  pixmap = (NativePixmap *)pNVar1;
  pNVar2 = EglTestContext::getNativeDisplay((this->super_TestCase).m_eglTestCtx);
  surface = (EGLSurface)
            (**(code **)(*(long *)pNVar1 + 0x20))
                      (pNVar1,pNVar2,this->m_display,this->m_config,0,0x100,0x100);
  pNVar2 = EglTestContext::getNativeDisplay((this->super_TestCase).m_eglTestCtx);
  local_38 = eglu::createPixmapSurface
                       (pNVar2,(NativePixmap *)surface,this->m_display,this->m_config,
                        (EGLAttrib *)0x0);
  std::vector<eglu::NativePixmap_*,_std::allocator<eglu::NativePixmap_*>_>::push_back
            (&this->m_pixmaps,(value_type *)&surface);
  std::vector<void_*,_std::allocator<void_*>_>::push_back(&this->m_surfaces,&local_38);
  return;
}

Assistant:

void MakeCurrentPerfCase::createPixmap (void)
{
	const Library&						egl				= m_eglTestCtx.getLibrary();
	const EGLint						width			= 256;
	const EGLint						height			= 256;

	const eglu::NativePixmapFactory&	pixmapFactory	= eglu::selectNativePixmapFactory(m_eglTestCtx.getNativeDisplayFactory(), m_testCtx.getCommandLine());

	eglu::NativePixmap*					pixmap			= DE_NULL;
	EGLSurface							surface			= EGL_NO_SURFACE;

	try
	{
		pixmap	= pixmapFactory.createPixmap(&m_eglTestCtx.getNativeDisplay(), m_display, m_config, DE_NULL, width, height);
		surface	= eglu::createPixmapSurface(m_eglTestCtx.getNativeDisplay(), *pixmap, m_display, m_config, DE_NULL);
	}
	catch (...)
	{
		if (surface != EGL_NO_SURFACE)
			egl.destroySurface(m_display, surface);

		delete pixmap;
		throw;
	}

	m_pixmaps.push_back(pixmap);
	m_surfaces.push_back(surface);
}